

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufCCat(xmlBufPtr buf,char *str)

{
  xmlChar xVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  
  iVar4 = -1;
  if ((buf != (xmlBufPtr)0x0) && (buf->error == 0)) {
    uVar5 = (ulong)buf->compat_size;
    if ((uVar5 < 0x7fffffff) && (buf->size != uVar5)) {
      buf->size = uVar5;
    }
    uVar5 = (ulong)buf->compat_use;
    if ((uVar5 < 0x7fffffff) && (buf->use != uVar5)) {
      buf->use = uVar5;
    }
    if ((str != (char *)0x0) && (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
      if (*str != '\0') {
        pcVar6 = str + 1;
        do {
          uVar5 = buf->use + 10;
          if ((buf->size <= uVar5) && (iVar4 = xmlBufResize(buf,uVar5), iVar4 == 0)) {
            __xmlSimpleError(0x1d,2,(xmlNodePtr)0x0,(char *)0x0,"growing buffer");
            if (buf->error != 0) {
              return 2;
            }
            buf->error = 2;
            return 2;
          }
          xVar1 = pcVar6[-1];
          sVar3 = buf->use;
          buf->use = sVar3 + 1;
          buf->content[sVar3] = xVar1;
          cVar2 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar2 != '\0');
      }
      buf->content[buf->use] = '\0';
      uVar5 = buf->size;
      if (0x7ffffffe < uVar5) {
        uVar5 = 0x7fffffff;
      }
      buf->compat_size = (uint)uVar5;
      uVar5 = 0x7fffffff;
      if (buf->use < 0x7fffffff) {
        uVar5 = buf->use;
      }
      buf->compat_use = (uint)uVar5;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int
xmlBufCCat(xmlBufPtr buf, const char *str) {
    const char *cur;

    if ((buf == NULL) || (buf->error))
        return(-1);
    CHECK_COMPAT(buf)
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return -1;
    if (str == NULL) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufCCat: str == NULL\n");
#endif
	return -1;
    }
    for (cur = str;*cur != 0;cur++) {
        if (buf->use  + 10 >= buf->size) {
            if (!xmlBufResize(buf, buf->use+10)){
		xmlBufMemoryError(buf, "growing buffer");
                return XML_ERR_NO_MEMORY;
            }
        }
        buf->content[buf->use++] = *cur;
    }
    buf->content[buf->use] = 0;
    UPDATE_COMPAT(buf)
    return 0;
}